

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O0

void Fxu_ListMatrixAddSingle(Fxu_Matrix *p,Fxu_Single *pLink)

{
  Fxu_ListSingle *pList;
  Fxu_Single *pLink_local;
  Fxu_Matrix *p_local;
  
  if ((p->lSingles).pHead == (Fxu_Single *)0x0) {
    (p->lSingles).pHead = pLink;
    (p->lSingles).pTail = pLink;
    pLink->pPrev = (Fxu_Single *)0x0;
    pLink->pNext = (Fxu_Single *)0x0;
  }
  else {
    pLink->pNext = (Fxu_Single *)0x0;
    ((p->lSingles).pTail)->pNext = pLink;
    pLink->pPrev = (p->lSingles).pTail;
    (p->lSingles).pTail = pLink;
  }
  (p->lSingles).nItems = (p->lSingles).nItems + 1;
  return;
}

Assistant:

void Fxu_ListMatrixAddSingle( Fxu_Matrix * p, Fxu_Single * pLink )
{
	Fxu_ListSingle * pList = &p->lSingles;
	if ( pList->pHead == NULL )
	{
		pList->pHead = pLink;
		pList->pTail = pLink;
		pLink->pPrev = NULL;
		pLink->pNext = NULL;
	}
	else
	{
		pLink->pNext = NULL;
		pList->pTail->pNext = pLink;
		pLink->pPrev = pList->pTail;
		pList->pTail = pLink;
	}
	pList->nItems++;
}